

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contour.cpp
# Opt level: O0

int __thiscall msdfgen::Contour::winding(Contour *this)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  EdgeSegment *pEVar4;
  reference this_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  EdgeHolder *extraout_XMM0_Qa;
  EdgeHolder *extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  undefined1 local_c0 [8];
  Point2 cur;
  __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
  local_a8;
  const_iterator edge;
  Point2 prev;
  Point2 d;
  Point2 c_1;
  Point2 b_1;
  Point2 a_1;
  Point2 c;
  Point2 b;
  Point2 a;
  double total;
  Contour *this_local;
  
  bVar1 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::empty
                    (&this->edges);
  if (bVar1) {
    this_local._4_4_ = 0;
  }
  else {
    a.y = 0.0;
    sVar2 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                      (&this->edges);
    if (sVar2 == 1) {
      pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                         (&this->edges,0);
      pEVar4 = EdgeHolder::operator->(pvVar3);
      (*pEVar4->_vptr_EdgeSegment[3])(0);
      pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                         (&this->edges,0);
      pEVar4 = EdgeHolder::operator->(pvVar3);
      (*pEVar4->_vptr_EdgeSegment[3])(0x3fd5555555555555);
      pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                         (&this->edges,0);
      pEVar4 = EdgeHolder::operator->(pvVar3);
      (*pEVar4->_vptr_EdgeSegment[3])(0x3fe5555555555555);
      dVar5 = shoelace((Point2 *)&b.y,(Point2 *)&c.y);
      dVar6 = shoelace((Point2 *)&c.y,(Point2 *)&a_1.y);
      dVar7 = shoelace((Point2 *)&a_1.y,(Point2 *)&b.y);
      a.y = dVar7 + dVar6 + dVar5 + 0.0;
    }
    else {
      sVar2 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                        (&this->edges);
      if (sVar2 == 2) {
        pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                           (&this->edges,0);
        pEVar4 = EdgeHolder::operator->(pvVar3);
        (*pEVar4->_vptr_EdgeSegment[3])(0);
        pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                           (&this->edges,0);
        pEVar4 = EdgeHolder::operator->(pvVar3);
        (*pEVar4->_vptr_EdgeSegment[3])(0x3fe0000000000000);
        pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                           (&this->edges,1);
        pEVar4 = EdgeHolder::operator->(pvVar3);
        (*pEVar4->_vptr_EdgeSegment[3])(0);
        pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                           (&this->edges,1);
        pEVar4 = EdgeHolder::operator->(pvVar3);
        (*pEVar4->_vptr_EdgeSegment[3])(0x3fe0000000000000);
        dVar5 = shoelace((Point2 *)&b_1.y,(Point2 *)&c_1.y);
        dVar6 = shoelace((Point2 *)&c_1.y,(Point2 *)&d.y);
        dVar7 = shoelace((Point2 *)&d.y,(Point2 *)&prev.y);
        dVar8 = shoelace((Point2 *)&prev.y,(Point2 *)&b_1.y);
        a.y = dVar8 + dVar7 + dVar6 + dVar5 + 0.0;
      }
      else {
        sVar2 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::size
                          (&this->edges);
        pvVar3 = std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::operator[]
                           (&this->edges,sVar2 - 1);
        pEVar4 = EdgeHolder::operator->(pvVar3);
        (*pEVar4->_vptr_EdgeSegment[3])(0);
        edge._M_current = extraout_XMM0_Qa;
        prev.x = in_XMM1_Qa;
        local_a8._M_current =
             (EdgeHolder *)
             std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::begin
                       (&this->edges);
        while( true ) {
          cur.y = (double)std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>::
                          end(&this->edges);
          bVar1 = __gnu_cxx::operator!=
                            (&local_a8,
                             (__normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                              *)&cur.y);
          if (!bVar1) break;
          this_00 = __gnu_cxx::
                    __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
                    ::operator*(&local_a8);
          pEVar4 = EdgeHolder::operator->(this_00);
          (*pEVar4->_vptr_EdgeSegment[3])(0);
          local_c0 = (undefined1  [8])extraout_XMM0_Qa_00;
          cur.x = in_XMM1_Qa;
          dVar5 = shoelace((Point2 *)&edge,(Point2 *)local_c0);
          a.y = dVar5 + a.y;
          edge._M_current = (EdgeHolder *)local_c0;
          prev.x = cur.x;
          __gnu_cxx::
          __normal_iterator<const_msdfgen::EdgeHolder_*,_std::vector<msdfgen::EdgeHolder,_std::allocator<msdfgen::EdgeHolder>_>_>
          ::operator++(&local_a8);
        }
      }
    }
    this_local._4_4_ = sign<double>(a.y);
  }
  return this_local._4_4_;
}

Assistant:

int Contour::winding() const {
    if (edges.empty())
        return 0;
    double total = 0;
    if (edges.size() == 1) {
        Point2 a = edges[0]->point(0), b = edges[0]->point(1/3.), c = edges[0]->point(2/3.);
        total += shoelace(a, b);
        total += shoelace(b, c);
        total += shoelace(c, a);
    } else if (edges.size() == 2) {
        Point2 a = edges[0]->point(0), b = edges[0]->point(.5), c = edges[1]->point(0), d = edges[1]->point(.5);
        total += shoelace(a, b);
        total += shoelace(b, c);
        total += shoelace(c, d);
        total += shoelace(d, a);
    } else {
        Point2 prev = edges[edges.size()-1]->point(0);
        for (std::vector<EdgeHolder>::const_iterator edge = edges.begin(); edge != edges.end(); ++edge) {
            Point2 cur = (*edge)->point(0);
            total += shoelace(prev, cur);
            prev = cur;
        }
    }
    return sign(total);
}